

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t parse_file_extra_htime(archive_read *a,archive_entry *e,rar5 *rar,int64_t *extra_data_size)

{
  byte bVar1;
  char cVar2;
  wchar_t wVar3;
  bool local_49;
  size_t local_48;
  size_t value_len;
  size_t flags;
  char has_atime;
  char has_ctime;
  char has_mtime;
  char has_unix_ns;
  int64_t *piStack_30;
  char unix_time;
  int64_t *extra_data_size_local;
  rar5 *rar_local;
  archive_entry *e_local;
  archive_read *a_local;
  
  value_len = 0;
  piStack_30 = extra_data_size;
  extra_data_size_local = (int64_t *)rar;
  rar_local = (rar5 *)e;
  e_local = (archive_entry *)a;
  wVar3 = read_var_sized(a,&value_len,&local_48);
  if (wVar3 == L'\0') {
    a_local._4_4_ = L'\x01';
  }
  else {
    *piStack_30 = *piStack_30 - local_48;
    wVar3 = consume((archive_read *)e_local,local_48);
    if (wVar3 == L'\0') {
      bVar1 = (byte)value_len;
      flags._7_1_ = bVar1 & 1;
      local_49 = (value_len & 1) != 0 && (value_len & 0x10) != 0;
      flags._6_1_ = local_49;
      flags._5_1_ = bVar1 & 2;
      flags._3_1_ = bVar1 & 8;
      flags._4_1_ = bVar1 & 4;
      *(undefined4 *)(extra_data_size_local + 0x97d) = 0;
      *(undefined4 *)((long)extra_data_size_local + 0x4bec) = 0;
      *(undefined4 *)(extra_data_size_local + 0x97e) = 0;
      if ((value_len & 2) != 0) {
        parse_htime_item((archive_read *)e_local,flags._7_1_,extra_data_size_local + 0x97a,
                         (uint32_t *)(extra_data_size_local + 0x97d),piStack_30);
      }
      if (flags._4_1_ != 0) {
        parse_htime_item((archive_read *)e_local,flags._7_1_,extra_data_size_local + 0x97b,
                         (uint32_t *)((long)extra_data_size_local + 0x4bec),piStack_30);
      }
      if (flags._3_1_ != 0) {
        parse_htime_item((archive_read *)e_local,flags._7_1_,extra_data_size_local + 0x97c,
                         (uint32_t *)(extra_data_size_local + 0x97e),piStack_30);
      }
      if ((flags._5_1_ != 0) && (flags._6_1_ != '\0')) {
        cVar2 = read_u32((archive_read *)e_local,(uint32_t *)(extra_data_size_local + 0x97d));
        if (cVar2 == '\0') {
          return L'\x01';
        }
        *piStack_30 = *piStack_30 + -4;
      }
      if ((flags._4_1_ != 0) && (flags._6_1_ != '\0')) {
        cVar2 = read_u32((archive_read *)e_local,(uint32_t *)((long)extra_data_size_local + 0x4bec))
        ;
        if (cVar2 == '\0') {
          return L'\x01';
        }
        *piStack_30 = *piStack_30 + -4;
      }
      if ((flags._3_1_ != 0) && (flags._6_1_ != '\0')) {
        cVar2 = read_u32((archive_read *)e_local,(uint32_t *)(extra_data_size_local + 0x97e));
        if (cVar2 == '\0') {
          return L'\x01';
        }
        *piStack_30 = *piStack_30 + -4;
      }
      if (flags._5_1_ != 0) {
        archive_entry_set_mtime
                  ((archive_entry *)rar_local,extra_data_size_local[0x97a],
                   (ulong)*(uint *)(extra_data_size_local + 0x97d));
      }
      if (flags._4_1_ != 0) {
        archive_entry_set_ctime
                  ((archive_entry *)rar_local,extra_data_size_local[0x97b],
                   (ulong)*(uint *)((long)extra_data_size_local + 0x4bec));
      }
      if (flags._3_1_ != 0) {
        archive_entry_set_atime
                  ((archive_entry *)rar_local,extra_data_size_local[0x97c],
                   (ulong)*(uint *)(extra_data_size_local + 0x97e));
      }
      a_local._4_4_ = L'\0';
    }
    else {
      a_local._4_4_ = L'\x01';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int parse_file_extra_htime(struct archive_read* a,
    struct archive_entry* e, struct rar5* rar, int64_t* extra_data_size)
{
	char unix_time, has_unix_ns, has_mtime, has_ctime, has_atime;
	size_t flags = 0;
	size_t value_len;

	enum HTIME_FLAGS {
		IS_UNIX       = 0x01,
		HAS_MTIME     = 0x02,
		HAS_CTIME     = 0x04,
		HAS_ATIME     = 0x08,
		HAS_UNIX_NS   = 0x10,
	};

	if(!read_var_sized(a, &flags, &value_len))
		return ARCHIVE_EOF;

	*extra_data_size -= value_len;
	if(ARCHIVE_OK != consume(a, value_len)) {
		return ARCHIVE_EOF;
	}

	unix_time = flags & IS_UNIX;
	has_unix_ns = unix_time && (flags & HAS_UNIX_NS);
	has_mtime = flags & HAS_MTIME;
	has_atime = flags & HAS_ATIME;
	has_ctime = flags & HAS_CTIME;
	rar->file.e_atime_ns = rar->file.e_ctime_ns = rar->file.e_mtime_ns = 0;

	if(has_mtime) {
		parse_htime_item(a, unix_time, &rar->file.e_mtime,
		    &rar->file.e_mtime_ns, extra_data_size);
	}

	if(has_ctime) {
		parse_htime_item(a, unix_time, &rar->file.e_ctime,
		    &rar->file.e_ctime_ns, extra_data_size);
	}

	if(has_atime) {
		parse_htime_item(a, unix_time, &rar->file.e_atime,
		    &rar->file.e_atime_ns, extra_data_size);
	}

	if(has_mtime && has_unix_ns) {
		if(!read_u32(a, &rar->file.e_mtime_ns))
			return ARCHIVE_EOF;

		*extra_data_size -= 4;
	}

	if(has_ctime && has_unix_ns) {
		if(!read_u32(a, &rar->file.e_ctime_ns))
			return ARCHIVE_EOF;

		*extra_data_size -= 4;
	}

	if(has_atime && has_unix_ns) {
		if(!read_u32(a, &rar->file.e_atime_ns))
			return ARCHIVE_EOF;

		*extra_data_size -= 4;
	}

	/* The seconds and nanoseconds are either together, or separated in two
	 * fields so we parse them, then set the archive_entry's times. */
	if(has_mtime) {
		archive_entry_set_mtime(e, rar->file.e_mtime, rar->file.e_mtime_ns);
	}

	if(has_ctime) {
		archive_entry_set_ctime(e, rar->file.e_ctime, rar->file.e_ctime_ns);
	}

	if(has_atime) {
		archive_entry_set_atime(e, rar->file.e_atime, rar->file.e_atime_ns);
	}

	return ARCHIVE_OK;
}